

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_function.hpp
# Opt level: O3

bool duckdb::MultiFileFunction<duckdb::ParquetMultiFileInfo>::TryOpenNextFile
               (ClientContext *context,MultiFileBindData *bind_data,MultiFileLocalState *scan_data,
               MultiFileGlobalState *global_state,unique_lock<std::mutex> *parallel_lock)

{
  unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
  *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  optional_ptr<duckdb::TableFilterSet,_true> table_filters;
  bool bVar1;
  int32_t val;
  ReaderInitializeType RVar2;
  TaskScheduler *this_01;
  unsigned_long uVar3;
  reference this_02;
  type reader_data;
  type pmVar4;
  MultiFileBindData *bind_data_p;
  InternalException *this_03;
  BaseUnionData *union_data_p;
  GlobalTableFunctionState *extraout_RDX;
  __int_type __n;
  ClientContext *file_idx;
  ulong uVar5;
  unique_lock<std::mutex> file_lock;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [32];
  optional_idx local_38;
  
  if (parallel_lock->_M_owns == false) {
    this_03 = (InternalException *)__cxa_allocate_exception(0x10);
    local_78._0_8_ = local_68;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_78,
               "parallel_lock is not held in TryOpenNextFile, this should not happen","");
    InternalException::InternalException(this_03,(string *)local_78);
    __cxa_throw(this_03,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  file_idx = (ClientContext *)parallel_lock;
  this_01 = TaskScheduler::GetScheduler(context);
  val = TaskScheduler::NumberOfThreads(this_01);
  uVar3 = NumericCastImpl<unsigned_long,_int,_false>::Convert(val);
  __n = (global_state->file_index).super___atomic_base<unsigned_long>._M_i;
  if (uVar3 != 0) {
    local_58._24_8_ = &global_state->readers;
    this = &global_state->global_state;
    local_58._16_8_ = &global_state->column_indexes;
    uVar5 = 0;
    do {
      if (((ulong)((long)(global_state->readers).
                         super_vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(global_state->readers).
                         super_vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) <= __n) &&
         (bVar1 = TryGetNextFile(global_state,parallel_lock), !bVar1)) {
        return false;
      }
      this_02 = vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_true>
                ::operator[]((vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_true>
                              *)local_58._24_8_,__n);
      reader_data = unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
                    ::operator*(this_02);
      if (reader_data->file_state == UNOPENED) {
        reader_data->file_state = OPENING;
        pmVar4 = unique_ptr<std::mutex,_std::default_delete<std::mutex>,_true>::operator*
                           (&reader_data->file_mutex);
        ::std::unique_lock<std::mutex>::unlock(parallel_lock);
        local_78[8] = false;
        local_78._0_8_ = pmVar4;
        ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_78);
        local_78[8] = true;
        if ((reader_data->union_data).internal.
            super___shared_ptr<duckdb::BaseUnionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
          ::operator*(this);
          ParquetMultiFileInfo::CreateReader
                    ((ParquetMultiFileInfo *)local_58,context,extraout_RDX,
                     &reader_data->file_to_be_opened,(idx_t)file_idx,bind_data);
        }
        else {
          bind_data_p = (MultiFileBindData *)
                        shared_ptr<duckdb::BaseUnionData,_true>::operator*(&reader_data->union_data)
          ;
          unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
          ::operator*(this);
          ParquetMultiFileInfo::CreateReader
                    ((ClientContext *)local_58,(GlobalTableFunctionState *)context,union_data_p,
                     bind_data_p);
        }
        this_00 = (reader_data->reader).internal.
                  super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi;
        (reader_data->reader).internal.
        super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_58._0_8_;
        (reader_data->reader).internal.
        super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        table_filters.ptr = (global_state->filters).ptr;
        optional_idx::optional_idx(&local_38,__n);
        file_idx = context;
        RVar2 = InitializeReader(reader_data,bind_data,
                                 (vector<duckdb::ColumnIndex,_true> *)local_58._16_8_,table_filters,
                                 context,local_38,
                                 (optional_ptr<duckdb::MultiFileReaderGlobalState,_true>)
                                 (global_state->multi_file_reader_state).
                                 super_unique_ptr<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
                                 ._M_t.
                                 super___uniq_ptr_impl<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_duckdb::MultiFileReaderGlobalState_*,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
                                 .super__Head_base<0UL,_duckdb::MultiFileReaderGlobalState_*,_false>
                                 ._M_head_impl);
        if (RVar2 != SKIP_READING_FILE) {
          shared_ptr<duckdb::BaseFileReader,_true>::operator*(&reader_data->reader);
          unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
          ::operator*(this);
        }
        ::std::unique_lock<std::mutex>::lock(parallel_lock);
        reader_data->file_state = RVar2 == SKIP_READING_FILE | OPEN;
        ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_78);
        if (RVar2 != SKIP_READING_FILE) {
          return true;
        }
      }
      else {
        uVar5 = uVar5 + 1;
      }
      __n = __n + 1;
    } while (uVar5 < uVar3);
  }
  return false;
}

Assistant:

static bool TryOpenNextFile(ClientContext &context, const MultiFileBindData &bind_data,
	                            MultiFileLocalState &scan_data, MultiFileGlobalState &global_state,
	                            unique_lock<mutex> &parallel_lock) {
		if (!parallel_lock.owns_lock()) {
			throw InternalException("parallel_lock is not held in TryOpenNextFile, this should not happen");
		}

		const auto file_lookahead_limit = NumericCast<idx_t>(TaskScheduler::GetScheduler(context).NumberOfThreads());

		idx_t file_index = global_state.file_index;
		idx_t i = 0;
		while (i < file_lookahead_limit) {
			// Try to get new files to open in this loop too otherwise we will only ever open 1 file ahead
			const bool has_file_to_read = file_index < global_state.readers.size();
			if (!has_file_to_read && !TryGetNextFile(global_state, parallel_lock)) {
				return false;
			}
			auto current_file_index = file_index++;

			auto &current_reader_data = *global_state.readers[current_file_index];
			if (current_reader_data.file_state == MultiFileFileState::UNOPENED) {
				current_reader_data.file_state = MultiFileFileState::OPENING;
				// Get pointer to file mutex before unlocking
				auto &current_file_lock = *current_reader_data.file_mutex;

				// Now we switch which lock we are holding, instead of locking the global state, we grab the lock on
				// the file we are opening. This file lock allows threads to wait for a file to be opened.
				parallel_lock.unlock();
				unique_lock<mutex> file_lock(current_file_lock);

				bool can_skip_file = false;
				try {
					if (current_reader_data.union_data) {
						auto &union_data = *current_reader_data.union_data;
						current_reader_data.reader =
						    OP::CreateReader(context, *global_state.global_state, union_data, bind_data);
					} else {
						current_reader_data.reader =
						    OP::CreateReader(context, *global_state.global_state, current_reader_data.file_to_be_opened,
						                     current_file_index, bind_data);
					}
					auto init_result = InitializeReader(current_reader_data, bind_data, global_state.column_indexes,
					                                    global_state.filters, context, current_file_index,
					                                    global_state.multi_file_reader_state);
					if (init_result == ReaderInitializeType::SKIP_READING_FILE) {
						//! File can be skipped entirely, close it and move on
						can_skip_file = true;
					} else {
						OP::FinalizeReader(context, *current_reader_data.reader, *global_state.global_state);
					}
				} catch (...) {
					parallel_lock.lock();
					global_state.error_opening_file = true;
					throw;
				}

				// Now re-lock the state and add the reader
				parallel_lock.lock();
				if (can_skip_file) {
					current_reader_data.file_state = MultiFileFileState::SKIPPED;
					//! Intentionally do not increase 'i'
					continue;
				}
				current_reader_data.file_state = MultiFileFileState::OPEN;
				return true;
			}
			i++;
		}

		return false;
	}